

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

int mg_fclose(mg_file_access *fileacc)

{
  int iVar1;
  
  if (fileacc != (mg_file_access *)0x0) {
    if ((FILE *)fileacc->fp == (FILE *)0x0) {
      iVar1 = -1;
    }
    else {
      iVar1 = fclose((FILE *)fileacc->fp);
    }
    fileacc->fp = (FILE *)0x0;
    return iVar1;
  }
  return -1;
}

Assistant:

static int
mg_fclose(struct mg_file_access *fileacc)
{
	int ret = -1;
	if (fileacc != NULL) {
		if (fileacc->fp != NULL) {
			ret = fclose(fileacc->fp);
		}
		/* reset all members of fileacc */
		memset(fileacc, 0, sizeof(*fileacc));
	}
	return ret;
}